

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

ssize_t __thiscall r_code::SysObject::write(SysObject *this,int __fd,void *__buf,size_t __n)

{
  SysView *pSVar1;
  Atom *pAVar2;
  uint *puVar3;
  SysView **ppSVar4;
  pointer ppSVar5;
  ulong i;
  undefined4 in_register_00000034;
  uint32_t *puVar6;
  ulong i_00;
  long lVar7;
  pointer i_01;
  ulong i_02;
  
  puVar6 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  *puVar6 = this->oid;
  puVar6[1] = (uint32_t)
              ((ulong)((long)(this->super_ImageObject).code.m_vector.
                             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->super_ImageObject).code.m_vector.
                            super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  puVar6[2] = (uint32_t)
              ((ulong)((long)(this->super_ImageObject).references.m_vector.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->super_ImageObject).references.m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  puVar6[3] = (uint32_t)
              ((ulong)((long)(this->markers).m_vector.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->markers).m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  puVar6[4] = (uint32_t)
              ((ulong)((long)(this->views).m_vector.
                             super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->views).m_vector.
                            super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((this->super_ImageObject).code.m_vector.
      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_ImageObject).code.m_vector.
      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_start) {
    i_02 = 0;
  }
  else {
    i_02 = 0;
    do {
      pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,i_02);
      puVar6[i_02 + 5] = pAVar2->atom;
      i_02 = i_02 + 1;
    } while (i_02 < (ulong)((long)(this->super_ImageObject).code.m_vector.
                                  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_ImageObject).code.m_vector.
                                  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if ((this->super_ImageObject).references.m_vector.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_ImageObject).references.m_vector.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      puVar3 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,i_00);
      puVar6[i_02 + i_00 + 5] = *puVar3;
      i_00 = i_00 + 1;
    } while (i_00 < (ulong)((long)(this->super_ImageObject).references.m_vector.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_ImageObject).references.m_vector.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if ((this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    i = 0;
  }
  else {
    i = 0;
    do {
      puVar3 = vector<unsigned_int>::operator[](&this->markers,i);
      puVar6[i_02 + i_00 + i + 5] = *puVar3;
      i = i + 1;
    } while (i < (ulong)((long)(this->markers).m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->markers).m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  ppSVar5 = (this->views).m_vector.
            super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar5 !=
      (this->views).m_vector.
      super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0;
    i_01 = (pointer)0x0;
    do {
      ppSVar4 = vector<r_code::SysView_*>::operator[](&this->views,(size_t)i_01);
      (*((*ppSVar4)->super_ImageObject)._vptr_ImageObject[2])
                (*ppSVar4,puVar6 + i_02 + i_00 + i + lVar7 + 5);
      ppSVar4 = vector<r_code::SysView_*>::operator[](&this->views,(size_t)i_01);
      pSVar1 = *ppSVar4;
      lVar7 = ((long)(pSVar1->super_ImageObject).references.m_vector.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pSVar1->super_ImageObject).references.m_vector.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) +
              ((long)(pSVar1->super_ImageObject).code.m_vector.
                     super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pSVar1->super_ImageObject).code.m_vector.
                     super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + lVar7 + 2;
      i_01 = (pointer)((long)i_01 + 1);
      ppSVar5 = (pointer)((long)(this->views).m_vector.
                                super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->views).m_vector.
                                super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
    } while (i_01 < ppSVar5);
  }
  return (ssize_t)ppSVar5;
}

Assistant:

void SysObject::write(uint32_t *data)
{
    data[0] = oid;
    data[1] = code.size();
    data[2] = references.size();
    data[3] = markers.size();
    data[4] = views.size();
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code.size(); ++i) {
        data[5 + i] = code[i].atom;
    }

    for (j = 0; j < references.size(); ++j) {
        data[5 + i + j] = references[j];
    }

    for (k = 0; k < markers.size(); ++k) {
        data[5 + i + j + k] = markers[k];
    }

    size_t offset = 0;

    for (l = 0; l < views.size(); ++l) {
        views[l]->write(data + 5 + i + j + k + offset);
        offset += views[l]->get_size();
    }
}